

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rq_matrix.c
# Opt level: O2

void rq_matrix_generate(m256v *M,parameters *P,int n_ESIs,uint32_t *ESIs)

{
  uint n_row;
  int n_col;
  long lVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint32_t *ISIs;
  undefined8 uStack_70;
  undefined1 local_68 [8];
  m256v HDPC;
  m256v LDPC;
  
  uVar2 = P->Kprime - P->K;
  n_row = uVar2 + n_ESIs;
  lVar1 = -((ulong)n_row * 4 + 0xf & 0xfffffffffffffff0);
  ISIs = (uint32_t *)(local_68 + lVar1);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < n_ESIs) {
    uVar4 = (ulong)(uint)n_ESIs;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    uVar5 = 0;
    if ((uint)P->K <= ESIs[uVar3]) {
      uVar5 = uVar2;
    }
    ISIs[uVar3] = uVar5 + ESIs[uVar3];
  }
  uVar4 = 0;
  uVar3 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    ISIs[(long)n_ESIs + uVar4] = P->K + (int)uVar4;
  }
  n_col = P->L;
  *(undefined8 *)(local_68 + lVar1 + -8) = 0x101463;
  m256v_get_subview((m256v *)&HDPC.e,M,0,0,n_row,n_col);
  *(undefined8 *)(local_68 + lVar1 + -8) = 0x101474;
  lt_generate_mat((m256v *)&HDPC.e,P,n_row,ISIs);
  uStack_70 = 0x101494;
  m256v_get_subview((m256v *)&HDPC.e,M,n_row,0,P->S,P->L);
  uStack_70 = 0x10149f;
  ldpc_generate_mat((m256v *)&HDPC.e,P);
  uStack_70 = 0x1014bf;
  m256v_get_subview((m256v *)local_68,M,n_row + P->S,0,P->H,P->L);
  uStack_70 = 0x1014ca;
  hdpc_generate_mat_faster((m256v *)local_68,P);
  return;
}

Assistant:

void rq_matrix_generate(m256v* M,
			const parameters* P,
			int n_ESIs,
			const uint32_t* ESIs)
{
	/* Check the matrix dimension */
	int n_rows, n_cols;
	rq_matrix_get_dim(P, n_ESIs, &n_rows, &n_cols);
	assert(n_rows == M->n_row);
	assert(n_cols == M->n_col);

	/* Write LT part of the matrix */
	int rowoffs = 0;
	{
		const int n_pad = P->Kprime - P->K;
		const int n_ISIs = n_ESIs + n_pad;

		/* Convert ESIs to ISIs, append padding symbols */
		uint32_t ISIs[n_ISIs];
		for (int i = 0; i < n_ESIs; ++i)
			ISIs[i] = ESIs[i] + (ESIs[i] >= P->K ? n_pad : 0);
		for (int i = 0; i < n_pad; ++i)
			ISIs[n_ESIs + i] = P->K + i;

		/* Write LT matrix */
		m256v LT = m256v_get_subview(M, 0, 0, n_ISIs, P->L);
		lt_generate_mat(&LT, P, n_ISIs, ISIs);

		rowoffs += n_ISIs;
	}

	/* Write LDPC part of the matrix */
	m256v LDPC = m256v_get_subview(M, rowoffs, 0, P->S, P->L);
	ldpc_generate_mat(&LDPC, P);
	rowoffs += P->S;

	/* Generate HDPC part of the matrix */
	m256v HDPC = m256v_get_subview(M, rowoffs, 0, P->H, P->L);
	hdpc_generate_mat(&HDPC, P);
	rowoffs += P->H;

	assert(rowoffs == n_rows);
}